

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-split.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
stringsplitter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
iter::operator*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                *__return_storage_ptr__,iter *this)

{
  char *pcVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  
  _Var2 = std::operator*((this->p)._M_current,(this->last)._M_current,this);
  (this->q)._M_current = _Var2._M_current;
  pcVar1 = (this->p)._M_current;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)__return_storage_ptr__,pcVar1,_Var2._M_current);
  return __return_storage_ptr__;
}

Assistant:

S operator*()
        {
            //q = std::find_first_of(p, last, std::begin(sep), std::end(sep));
            q = std::find_if(p, last, [this](auto c) { return std::find(std::begin(sep), std::end(sep), c) != std::end(sep); });

            //q = std::search(p, last, std::begin(sep), std::end(sep));

            // workaround for lack of iterator variant of stringview
            if constexpr (std::is_same_v<S, std::string_view>) {
                return S(&*p, q-p);
            }
            else {
                return S(p, q);
            }
        }